

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O0

bool GetLabelValue(char **p,aint *val)

{
  SLabelTableEntry *pSVar1;
  SLabelTableEntry *labelEntry;
  aint *val_local;
  char **p_local;
  
  pSVar1 = GetLabel(p);
  if (pSVar1 == (SLabelTableEntry *)0x0) {
    *val = 0;
  }
  else {
    *val = pSVar1->value;
    if ((Relocation::areLabelsOffset & 1) != 0) {
      if (pSVar1->isRelocatable == REGULAR) {
        *val = Relocation::alternative_offset + *val;
      }
      else if (pSVar1->isRelocatable == HIGH) {
        *val = (Relocation::alternative_offset >> 8) + *val;
      }
    }
  }
  return (bool)((getLabel_invalidName ^ 0xffU) & 1);
}

Assistant:

bool GetLabelValue(char*& p, aint& val) {
	SLabelTableEntry* labelEntry = GetLabel(p);
	if (labelEntry) {
		val = labelEntry->value;
		if (Relocation::areLabelsOffset) {
			switch (labelEntry->isRelocatable) {
				case Relocation::REGULAR:	val += Relocation::alternative_offset;			break;
				case Relocation::HIGH:		val += Relocation::alternative_offset >> 8;		break;
				default:					;
			}
		}
	} else {
		val = 0;
	}
	// true even when not found, but valid label name (needed for expression-eval logic)
	return !getLabel_invalidName;
}